

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# euler.c
# Opt level: O3

void glmc_euler_xzy(float *angles,vec4 *dest)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  
  fVar1 = sinf(*angles);
  fVar2 = cosf(*angles);
  fVar3 = sinf(angles[1]);
  fVar4 = cosf(angles[1]);
  fVar5 = sinf(angles[2]);
  fVar6 = cosf(angles[2]);
  (*dest)[0] = fVar4 * fVar6;
  dest[1][0] = -fVar5;
  *(ulong *)(dest[1] + 1) = CONCAT44(fVar6 * fVar1,fVar6 * fVar2);
  dest[2][0] = fVar3 * fVar6;
  *(ulong *)(*dest + 1) =
       CONCAT44(fVar4 * fVar1 * fVar5 + -(fVar3 * fVar2),fVar4 * fVar2 * fVar5 + fVar3 * fVar1);
  *(ulong *)(dest[2] + 1) =
       CONCAT44(fVar3 * fVar1 * fVar5 + fVar4 * fVar2,fVar3 * fVar2 * fVar5 + -(fVar4 * fVar1));
  (*dest)[3] = 0.0;
  dest[1][3] = 0.0;
  *(undefined8 *)(dest[2] + 3) = 0;
  *(float *)((long)(dest + 3) + 4) = 0.0;
  *(float *)((long)(dest + 3) + 8) = 0.0;
  dest[3][3] = 1.0;
  return;
}

Assistant:

CGLM_EXPORT
void
glmc_euler_xzy(vec3 angles, mat4 dest) {
  glm_euler_xzy(angles, dest);
}